

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O1

void __thiscall
jsoncons::stream_source<unsigned_char>::stream_source(stream_source<unsigned_char> *this)

{
  value_type_conflict *__val;
  pointer puVar1;
  
  basic_null_istream<char>::basic_null_istream(&this->null_is_);
  this->stream_ptr_ = (basic_istream<char,_std::char_traits<char>_> *)this;
  this->sbuf_ = *(basic_streambuf<char,_std::char_traits<char>_> **)
                 (&(this->null_is_).super_basic_istream<char,_std::char_traits<char>_>.field_0xe8 +
                 (long)(this->null_is_).super_basic_istream<char,_std::char_traits<char>_>.
                       _vptr_basic_istream[-3]);
  this->position_ = 0;
  (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (pointer)operator_new(1);
  (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar1;
  (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1 + 1;
  *puVar1 = '\0';
  (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1 + 1;
  this->buffer_data_ = puVar1;
  this->buffer_length_ = 0;
  return;
}

Assistant:

stream_source()
            : stream_ptr_(&null_is_), sbuf_(null_is_.rdbuf()),
              buffer_(1), buffer_data_(buffer_.data())
        {
        }